

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiowrt.c
# Opt level: O0

void fiowcls(osfildef *fp,errcxdef *ec,ulong respos)

{
  errcxdef *ctx;
  size_t sVar1;
  long in_RDX;
  FILE *in_RDI;
  char buf [4];
  ulong endpos;
  char *in_stack_ffffffffffffffd8;
  
  ctx = (errcxdef *)ftell(in_RDI);
  fseek(in_RDI,in_RDX,0);
  oswp4(&stack0xffffffffffffffdc,(unsigned_long)ctx);
  sVar1 = fwrite(&stack0xffffffffffffffdc,4,1,in_RDI);
  if (sVar1 != 1) {
    errsigf(ctx,in_stack_ffffffffffffffd8,0);
  }
  fseek(in_RDI,(long)ctx,0);
  return;
}

Assistant:

static void fiowcls(osfildef *fp, errcxdef *ec, ulong respos)
{
    ulong endpos;
    char  buf[4];
    
    endpos = osfpos(fp);
    osfseek(fp, respos, OSFSK_SET);
    oswp4(buf, endpos);
    if (osfwb(fp, buf, 4)) errsig(ec, ERR_WRTGAM);
    osfseek(fp, endpos, OSFSK_SET);
}